

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O0

void dill_raw_putreg(dill_stream_conflict s,dill_reg reg,int type)

{
  byte bVar1;
  int in_EDX;
  uint in_ESI;
  dill_stream_conflict in_RDI;
  
  bVar1 = (byte)in_ESI;
  if (in_EDX == 9 || in_EDX == 10) {
    if ((1L << (bVar1 & 0x3f) & (in_RDI->p->tmp_f).members[0]) == 1L << (bVar1 & 0x3f)) {
      dill_alloc_specific(in_RDI,in_ESI,in_EDX,1);
    }
    else if ((1L << (bVar1 & 0x3f) & (in_RDI->p->var_f).members[0]) == 1L << (bVar1 & 0x3f)) {
      dill_alloc_specific(in_RDI,in_ESI,in_EDX,0);
    }
    else if (((in_RDI->p->var_f).members[0] != 0) || (in_ESI != 0xffffffff)) {
      printf("Putreg not in set error %d\n",(ulong)in_ESI);
    }
  }
  else if ((1L << (bVar1 & 0x3f) & (in_RDI->p->tmp_i).members[0]) == 1L << (bVar1 & 0x3f)) {
    dill_alloc_specific(in_RDI,in_ESI,in_EDX,1);
  }
  else if ((1L << (bVar1 & 0x3f) & (in_RDI->p->var_i).members[0]) == 1L << (bVar1 & 0x3f)) {
    dill_alloc_specific(in_RDI,in_ESI,in_EDX,0);
  }
  else {
    printf("Putreg not in set error %d\n",(ulong)in_ESI);
  }
  return;
}

Assistant:

extern void
dill_raw_putreg(dill_stream s, dill_reg reg, int type)
{
    switch (type) {
    case DILL_F:
    case DILL_D:
        if (BIT_ON(reg, s->p->tmp_f.members)) {
            dill_alloc_specific(s, reg, type, DILL_TEMP);
        } else if (BIT_ON(reg, s->p->var_f.members)) {
            dill_alloc_specific(s, reg, type, DILL_VAR);
        } else {
            /*
             * special case, if the put reg is invalid (-1) and
             * the member set is empty, give no warning.
             */
            if ((s->p->var_f.members[0] != 0) || (reg != -1)) {
                printf("Putreg not in set error %d\n", reg);
            }
        }
        break;
    default:
        if (BIT_ON(reg, s->p->tmp_i.members)) {
            dill_alloc_specific(s, reg, type, DILL_TEMP);
        } else if (BIT_ON(reg, s->p->var_i.members)) {
            dill_alloc_specific(s, reg, type, DILL_VAR);
        } else {
            printf("Putreg not in set error %d\n", reg);
        }
        break;
    }
}